

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O3

timer_ptr __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::set_timer
          (connection<websocketpp::config::asio::transport_config> *this,long duration,
          timer_handler *callback)

{
  element_type *peVar1;
  undefined8 *puVar2;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  function<void_(const_std::error_code_&)> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  timer_ptr tVar5;
  undefined1 local_f9;
  undefined1 local_f8 [32];
  pointer local_d8;
  element_type *peStack_d0;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  undefined1 auStack_c0 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  undefined1 local_98 [32];
  _Any_data local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  
  local_98._0_8_ = *(undefined8 *)(duration + 0xb0);
  (this->super_socket_con_type).
  super_enable_shared_from_this<websocketpp::transport::asio::basic_socket::connection>._M_weak_this
  .
  super___weak_ptr<websocketpp::transport::asio::basic_socket::connection,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_f8._0_8_ = callback;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>,std::allocator<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,std::reference_wrapper<asio::io_context>,std::chrono::duration<long,std::ratio<1l,1000l>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_socket_con_type).
              super_enable_shared_from_this<websocketpp::transport::asio::basic_socket::connection>.
              _M_weak_this.
              super___weak_ptr<websocketpp::transport::asio::basic_socket::connection,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
              **)this,(allocator<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                       *)&local_f9,(reference_wrapper<asio::io_context> *)local_98,
             (duration<long,_std::ratio<1L,_1000L>_> *)local_f8);
  peVar1 = (this->super_socket_con_type).
           super_enable_shared_from_this<websocketpp::transport::asio::basic_socket::connection>.
           _M_weak_this.
           super___weak_ptr<websocketpp::transport::asio::basic_socket::connection,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  puVar2 = *(undefined8 **)(duration + 0xb8);
  get_shared((connection<websocketpp::config::asio::transport_config> *)local_f8);
  local_f8._16_8_ = handle_timer;
  local_f8._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  _Tuple_impl<1ul,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>>
  ::
  _Tuple_impl<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>&,std::function<void(std::error_code_const&)>&,std::_Placeholder<1>const&,void>
            ((_Tuple_impl<1ul,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>>
              *)&local_d8,
             (shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
              *)this,in_RCX,(_Placeholder<1> *)&std::placeholders::_1);
  _Var3._M_pi = local_c8._M_pi;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_;
  local_48 = (element_type *)local_f8._0_8_;
  local_f8._0_8_ = 0;
  local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98._0_8_ = *puVar2;
  local_98._8_8_ = puVar2[1];
  local_98._16_8_ = local_f8._16_8_;
  local_98._24_8_ = local_f8._24_8_;
  local_78._M_unused._M_object = (pointer)0x0;
  local_78._8_8_ = (element_type *)0x0;
  local_68._M_allocated_capacity = 0;
  local_68._8_8_ = auStack_c0._0_8_;
  if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    auStack_c0._0_8_ = (void *)0x0;
    local_78._M_unused._M_object = local_d8;
    local_78._8_8_ = peStack_d0;
    local_68._M_allocated_capacity = (size_type)_Var3._M_pi;
  }
  local_58 = (element_type *)auStack_c0._8_8_;
  _Stack_50._M_pi = p_Stack_b0;
  register0x00001200 = ZEXT832(0) << 0x20;
  ::asio::detail::
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
  ::
  async_wait<asio::detail::wrapped_handler<asio::io_context::strand,std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,std::function<void(std::error_code_const&)>,std::error_code_const&)>,asio::detail::is_continuation_if_running>>
            (*(deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
               **)&(peVar1->
                   super_enable_shared_from_this<websocketpp::transport::asio::basic_socket::connection>
                   )._M_weak_this,
             (implementation_type *)
             ((long)&(peVar1->
                     super_enable_shared_from_this<websocketpp::transport::asio::basic_socket::connection>
                     )._M_weak_this + 8),
             (wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>
              *)local_98);
  _Var4._M_pi = extraout_RDX;
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
    _Var4._M_pi = extraout_RDX_00;
  }
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
    _Var4._M_pi = extraout_RDX_01;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(code *)local_68._M_allocated_capacity)(&local_78,&local_78,3);
    _Var4._M_pi = extraout_RDX_02;
  }
  if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
    _Var4._M_pi = extraout_RDX_03;
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
    _Var4._M_pi = extraout_RDX_04;
  }
  if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(code *)local_c8._M_pi)
              ((_Tuple_impl<1ul,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>>
                *)&local_d8,
               (_Tuple_impl<1ul,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>>
                *)&local_d8,3);
    _Var4._M_pi = extraout_RDX_05;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    _Var4._M_pi = extraout_RDX_06;
  }
  tVar5.
  super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var4._M_pi;
  tVar5.
  super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (timer_ptr)
         tVar5.
         super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

timer_ptr set_timer(long duration, timer_handler callback) {
        timer_ptr new_timer = lib::make_shared<lib::asio::steady_timer>(
            lib::ref(*m_io_service),
            lib::asio::milliseconds(duration)
        );

        if (config::enable_multithreading) {
            new_timer->async_wait(m_strand->wrap(lib::bind(
                &type::handle_timer, get_shared(),
                new_timer,
                callback,
                lib::placeholders::_1
            )));
        } else {
            new_timer->async_wait(lib::bind(
                &type::handle_timer, get_shared(),
                new_timer,
                callback,
                lib::placeholders::_1
            ));
        }

        return new_timer;
    }